

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O1

Result __thiscall
presolve::HPresolve::initialRowAndColPresolve(HPresolve *this,HighsPostsolveStack *postsolve_stack)

{
  Result RVar1;
  Result RVar2;
  HighsLp *pHVar3;
  Result unaff_EBP;
  HighsInt col;
  ulong uVar4;
  bool bVar5;
  
  bVar5 = this->model->num_row_ == 0;
  RVar1 = unaff_EBP;
  if (!bVar5) {
    uVar4 = 0;
    do {
      if ((this->rowDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] == '\0') {
        RVar1 = rowPresolve(this,postsolve_stack,(HighsInt)uVar4);
        if (RVar1 != kOk) break;
        (this->changedRowFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start[uVar4] = '\0';
      }
      uVar4 = uVar4 + 1;
      bVar5 = uVar4 == (uint)this->model->num_row_;
      RVar1 = unaff_EBP;
    } while (!bVar5);
  }
  if (bVar5) {
    pHVar3 = this->model;
    bVar5 = pHVar3->num_col_ == 0;
    RVar2 = RVar1;
    if (!bVar5) {
      uVar4 = 0;
      do {
        if ((this->colDeleted).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar4] == '\0') {
          col = (HighsInt)uVar4;
          if ((pHVar3->integrality_).super__Vector_base<HighsVarType,_std::allocator<HighsVarType>_>
              ._M_impl.super__Vector_impl_data._M_start[uVar4] != kContinuous) {
            changeColLower(this,col,(pHVar3->col_lower_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar4]);
            changeColUpper(this,col,(this->model->col_upper_).
                                    super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                    super__Vector_impl_data._M_start[uVar4]);
          }
          RVar2 = colPresolve(this,postsolve_stack,col);
          if (RVar2 != kOk) break;
          (this->changedColFlag).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start[uVar4] = '\0';
        }
        uVar4 = uVar4 + 1;
        pHVar3 = this->model;
        bVar5 = uVar4 == (uint)pHVar3->num_col_;
        RVar2 = RVar1;
      } while (!bVar5);
    }
    RVar1 = RVar2;
    if (bVar5) {
      RVar1 = checkLimits(this,postsolve_stack);
      return RVar1;
    }
  }
  return RVar1;
}

Assistant:

HPresolve::Result HPresolve::initialRowAndColPresolve(
    HighsPostsolveStack& postsolve_stack) {
  // do a full scan over the rows as the singleton arrays and the changed row
  // arrays are not initialized, also unset changedRowFlag so that the row will
  // be added to the changed row vector when it is changed after it was
  // processed
  for (HighsInt row = 0; row != model->num_row_; ++row) {
    if (rowDeleted[row]) continue;
    HPRESOLVE_CHECKED_CALL(rowPresolve(postsolve_stack, row));
    changedRowFlag[row] = false;
  }

  // same for the columns
  for (HighsInt col = 0; col != model->num_col_; ++col) {
    if (colDeleted[col]) continue;
    if (model->integrality_[col] != HighsVarType::kContinuous) {
      // round and update bounds
      changeColLower(col, model->col_lower_[col]);
      changeColUpper(col, model->col_upper_[col]);
    }
    HPRESOLVE_CHECKED_CALL(colPresolve(postsolve_stack, col));
    changedColFlag[col] = false;
  }

  return checkLimits(postsolve_stack);
}